

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_length_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls1)

{
  bool bVar1;
  sexp_uint_t res;
  sexp ls2;
  sexp ls1_local;
  sexp_sint_t n_local;
  sexp self_local;
  sexp ctx_local;
  sexp local_8;
  
  res = 1;
  if ((((ulong)ls1 & 3) == 0) && (ls1->tag == 6)) {
    ls2 = (ls1->value).type.cpl;
    ls1_local = ls1;
    while( true ) {
      bVar1 = false;
      if (((((ulong)ls2 & 3) == 0) && (bVar1 = false, ls2->tag == 6)) &&
         (bVar1 = false, ((ls2->value).string.offset & 3) == 0)) {
        bVar1 = ((ls2->value).type.cpl)->tag == 6;
      }
      if (!bVar1) {
        bVar1 = false;
        if (((ulong)ls2 & 3) == 0) {
          bVar1 = ls2->tag == 6;
        }
        return (sexp)((res + (long)(int)(uint)bVar1) * 2 | 1);
      }
      if (ls1_local == ls2) break;
      res = res + 2;
      ls1_local = (ls1_local->value).type.cpl;
      ls2 = (((ls2->value).type.cpl)->value).type.cpl;
    }
    local_8 = (sexp)&DAT_0000003e;
  }
  else {
    local_8 = (sexp)&DAT_00000001;
  }
  return local_8;
}

Assistant:

sexp sexp_length_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls1) {
  sexp ls2;
  sexp_uint_t res = 1;
  if (!sexp_pairp(ls1))
    return SEXP_ZERO;
  for (ls2=sexp_cdr(ls1); sexp_pairp(ls2) && sexp_pairp(sexp_cdr(ls2));
       res+=2, ls1=sexp_cdr(ls1), ls2=sexp_cddr(ls2))
    if (ls1 == ls2)
      return SEXP_FALSE;
  return sexp_make_fixnum(res + (sexp_pairp(ls2) ? 1 : 0));
}